

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

string * google::protobuf::compiler::cpp::QualifiedFileLevelSymbol
                   (string *__return_storage_ptr__,string *package,string *name)

{
  AlphaNum *in_RCX;
  AlphaNum *in_R9;
  string local_110;
  AlphaNum local_f0;
  char *local_c0;
  undefined8 local_b8;
  AlphaNum local_90;
  AlphaNum local_60;
  
  if (package->_M_string_length == 0) {
    local_c0 = "::";
    local_b8 = 2;
    local_f0.piece_data_ = (name->_M_dataplus)._M_p;
    local_f0.piece_size_ = name->_M_string_length;
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_c0,&local_f0,in_RCX);
  }
  else {
    local_c0 = "::";
    local_b8 = 2;
    anon_unknown_0::DotsToColons(&local_110,package);
    local_f0.piece_data_ = local_110._M_dataplus._M_p;
    local_f0.piece_size_ = local_110._M_string_length;
    local_60.piece_data_ = "::";
    local_60.piece_size_ = 2;
    local_90.piece_data_ = (name->_M_dataplus)._M_p;
    local_90.piece_size_ = name->_M_string_length;
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_c0,&local_f0,&local_60,&local_90,
                      in_R9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string QualifiedFileLevelSymbol(const string& package, const string& name) {
  if (package.empty()) {
    return StrCat("::", name);
  }
  return StrCat("::", DotsToColons(package), "::", name);
}